

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool kwssys::SystemTools::StringEndsWith(string *str1,char *str2)

{
  int iVar1;
  ulong uVar2;
  size_t __n;
  long lVar3;
  char *in_RSI;
  size_t len2;
  size_t len1;
  undefined1 local_1;
  
  if (in_RSI == (char *)0x0) {
    local_1 = false;
  }
  else {
    uVar2 = std::__cxx11::string::size();
    __n = strlen(in_RSI);
    local_1 = false;
    if (__n <= uVar2) {
      lVar3 = std::__cxx11::string::c_str();
      iVar1 = strncmp((char *)(lVar3 + (uVar2 - __n)),in_RSI,__n);
      local_1 = iVar1 == 0;
    }
  }
  return local_1;
}

Assistant:

bool SystemTools::StringEndsWith(const std::string& str1, const char* str2)
{
  if (!str2) {
    return false;
  }
  size_t len1 = str1.size(), len2 = strlen(str2);
  return len1 >= len2 && !strncmp(str1.c_str() + (len1 - len2), str2, len2)
    ? true
    : false;
}